

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O1

void __thiscall Quad::Quad(Quad *this,Quad *quadToCopy)

{
  Vec2d **ppVVar1;
  Vec2d *this_00;
  long lVar2;
  
  this->vertexCount = 0;
  this->vertices = (Vec2d **)0x0;
  this->fillColour = (Colour *)0x0;
  this->lineColour = (Colour *)0x0;
  ppVVar1 = (Vec2d **)operator_new__(0x20);
  this->vertices = ppVVar1;
  this->vertexCount = quadToCopy->vertexCount;
  this->fillColour = quadToCopy->fillColour;
  this->lineColour = quadToCopy->lineColour;
  ppVVar1 = quadToCopy->vertices;
  lVar2 = 0;
  do {
    this_00 = (Vec2d *)operator_new(8);
    Vec2d::Vec2d(this_00,ppVVar1[lVar2]);
    this->vertices[lVar2] = this_00;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

Quad::Quad(Quad* quadToCopy)    {
    vertices = new Vec2d*[4];
    
    vertexCount = quadToCopy->getVertexCount();
    fillColour = quadToCopy->getFillColour();
    lineColour = quadToCopy->getLineColour();
    Vec2d** verticesToCopy = quadToCopy->getVertices();
    for (int i = 0; i < 4; i++) {
        vertices[i] = new Vec2d(verticesToCopy[i]);
    }
    verticesToCopy = nullptr;
}